

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_strnicmp(char *zLeft,char *zRight,int N)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  if (zLeft == (char *)0x0) {
    iVar1 = -(uint)(zRight != (char *)0x0);
  }
  else {
    if (zRight == (char *)0x0) {
      return 1;
    }
    iVar1 = 0;
    lVar2 = 0;
    for (; 0 < N; N = N + -1) {
      if ((ulong)(byte)zLeft[lVar2] == 0) {
        uVar3 = 0;
LAB_00149bf1:
        return uVar3 - ""[(byte)zRight[lVar2]];
      }
      uVar3 = (uint)""[(byte)zLeft[lVar2]];
      if (""[(byte)zLeft[lVar2]] != ""[(byte)zRight[lVar2]]) goto LAB_00149bf1;
      lVar2 = lVar2 + 1;
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_strnicmp(const char *zLeft, const char *zRight, int N){
  register unsigned char *a, *b;
  if( zLeft==0 ){
    return zRight ? -1 : 0;
  }else if( zRight==0 ){
    return 1;
  }
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  while( N-- > 0 && *a!=0 && UpperToLower[*a]==UpperToLower[*b]){ a++; b++; }
  return N<0 ? 0 : UpperToLower[*a] - UpperToLower[*b];
}